

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  variant<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *__v;
  bool bVar1;
  int level;
  Argument *pAVar2;
  char *__end;
  function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__storage;
  string_view arg_name;
  string_view arg_name_00;
  logger log;
  lmss l;
  ArgumentParser app;
  logger local_404;
  anon_class_1_0_00000001 local_3fd;
  int local_3fc [7];
  any local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  undefined1 local_330 [16];
  event_loop local_320 [3];
  ArgumentParser local_218;
  
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"lmss","");
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"4.2.3","");
  argparse::ArgumentParser::ArgumentParser
            (&local_218,&local_390,&local_3b0,help,true,(ostream *)&std::cout);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>(&local_218,"-v");
  local_330._0_4_ = 3;
  pAVar2 = argparse::Argument::default_value<int>(pAVar2,(int *)local_330);
  local_404.ll = 0;
  local_3fc[0] = 1;
  local_3fc[6] = 2;
  local_3fc[5] = 3;
  local_3fc[4] = 4;
  local_3fc[3] = 5;
  local_3fc[2] = 6;
  local_3fc[1] = 7;
  argparse::Argument::add_choice<int>(pAVar2,&local_404.ll);
  argparse::Argument::add_choice<int>(pAVar2,local_3fc);
  argparse::Argument::choices<int,int,int,int,int,int>
            (pAVar2,local_3fc + 6,local_3fc + 5,local_3fc + 4,local_3fc + 3,local_3fc + 2,
             local_3fc + 1);
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"LEVEL","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->m_metavar,&local_3d0);
  (pAVar2->m_num_args_range).m_min = 1;
  (pAVar2->m_num_args_range).m_max = 1;
  __v = &pAVar2->m_action;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_&>
    ::_S_vtable._M_arr
    [*(__index_type *)
      ((long)&(pAVar2->m_action).
              super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
              .
              super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
              .
              super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
              .
              super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
              .
              super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
              .
              super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
      + 0x20)]._M_data)(&local_3fd,__v);
  *(__index_type *)
   ((long)&(pAVar2->m_action).
           super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           .
           super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
   + 0x20) = 0xff;
  *(undefined8 *)
   &(__v->
    super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ).
    super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(pAVar2->m_action).
           super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           .
           super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(pAVar2->m_action).
           super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           .
           super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
   + 0x10) = 0;
  *(code **)((long)&(pAVar2->m_action).
                    super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    .
                    super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
            + 0x18) =
       std::
       _Function_handler<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_argparse::details::parse_number<int,_0>_>
       ::_M_invoke;
  *(code **)((long)&(pAVar2->m_action).
                    super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    .
                    super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
            + 0x10) =
       std::
       _Function_handler<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_argparse::details::parse_number<int,_0>_>
       ::_M_manager;
  *(__index_type *)
   ((long)&(pAVar2->m_action).
           super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           .
           super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
   + 0x20) = '\0';
  std::
  get<0ul,std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
            (__v);
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"set log verbosity (0-7)","")
  ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->m_help,&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&local_218,"-V","--version");
  local_330._0_8_ = local_330._0_8_ & 0xffffffffffffff00;
  pAVar2 = argparse::Argument::default_value<bool>(pAVar2,(bool *)local_330);
  local_3e0._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_3e0._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar2->m_implicit_value,&local_3e0);
  (pAVar2->m_num_args_range).m_min = 0;
  (pAVar2->m_num_args_range).m_max = 0;
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"print lmss version","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->m_help,&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if (local_3e0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_3e0._M_manager)(_Op_destroy,&local_3e0,(_Arg *)0x0);
    local_3e0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  argparse::ArgumentParser::parse_args(&local_218,argc,argv);
  arg_name._M_str = "-V";
  arg_name._M_len = 2;
  bVar1 = argparse::ArgumentParser::get<bool>(&local_218,arg_name);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lmss version ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"4.2.3",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    argparse::ArgumentParser::~ArgumentParser(&local_218);
    return 0;
  }
  arg_name_00._M_str = "-v";
  arg_name_00._M_len = 2;
  level = argparse::ArgumentParser::get<int>(&local_218,arg_name_00);
  local_330._0_8_ = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"LMSS","");
  logger::logger(&local_404,(string *)local_330,level);
  if ((event_loop *)local_330._0_8_ != local_320) {
    operator_delete((void *)local_330._0_8_,(ulong)((long)local_320[0].log + 1));
  }
  do {
    lmss::lmss((lmss *)local_330,&local_404);
    event_loop::run(local_320);
    lmss::~lmss((lmss *)local_330);
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
    argparse::ArgumentParser app("lmss", VERSION, argparse::default_arguments::help);
    app.add_argument("-v")
        .default_value(3)
        .choices(0, 1, 2, 3, 4, 5, 6, 7)
        .metavar("LEVEL")
        .nargs(1)
        .scan<'i', int>()
        .help("set log verbosity (0-7)");
    app.add_argument("-V", "--version")
        .default_value(false)
        .implicit_value(true)
        .help("print lmss version");

    try {
        app.parse_args(argc, argv);
    } catch (std::exception const & e) {
        std::cerr << e.what() << std::endl;
        std::cerr << app;
        std::exit(1);
    }

    if (app.get<bool>("-V")) {
        std::cout << "lmss version " << VERSION << std::endl;
        return 0;
    }

    auto log_level = app.get<int>("-v");

    logger log("LMSS", log_level);

    while (true) {
        try {
            lmss l(log);
            l.run();
        } catch (std::runtime_error const & e) {
            log.err(e.what());
            log.warn("reinitializing");
            std::this_thread::sleep_for(std::chrono::seconds(1));
        }
    }

    return 0;
}